

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::PaddingLayerParams::set_allocated_constant
          (PaddingLayerParams *this,PaddingLayerParams_PaddingConstant *constant)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_PaddingType(this);
  if (constant != (PaddingLayerParams_PaddingConstant *)0x0) {
    submessage_arena = (Arena *)(constant->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 2) == 0) {
      if (((ulong)submessage_arena & 1) != 0) {
        submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffc);
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      constant = (PaddingLayerParams_PaddingConstant *)
                 google::protobuf::internal::GetOwnedMessageInternal
                           (message_arena,&constant->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 1;
    (this->PaddingType_).constant_ = constant;
  }
  return;
}

Assistant:

void PaddingLayerParams::set_allocated_constant(::CoreML::Specification::PaddingLayerParams_PaddingConstant* constant) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_PaddingType();
  if (constant) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::PaddingLayerParams_PaddingConstant>::GetOwningArena(constant);
    if (message_arena != submessage_arena) {
      constant = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, constant, submessage_arena);
    }
    set_has_constant();
    PaddingType_.constant_ = constant;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.PaddingLayerParams.constant)
}